

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clCommandFillImageKHR
                 (cl_command_buffer_khr command_buffer,cl_command_queue command_queue,
                 cl_command_properties_khr *properties,cl_mem image,void *fill_color,size_t *origin,
                 size_t *region,cl_uint num_sync_points_in_wait_list,
                 cl_sync_point_khr *sync_point_wait_list,cl_sync_point_khr *sync_point,
                 cl_mutable_command_khr *mutable_handle)

{
  int iVar1;
  uint64_t enqueueCounter_00;
  cl_int cVar2;
  CLIntercept *pCVar3;
  SConfig *pSVar4;
  undefined8 uVar5;
  time_point tVar6;
  time_point tickEnd;
  SConfig *pSVar7;
  cl_mem in_RCX;
  cl_command_properties_khr *in_RDX;
  cl_command_queue in_RSI;
  cl_command_buffer_khr in_RDI;
  CLIntercept *in_R8;
  size_t *in_R9;
  size_t *in_stack_00000008;
  cl_uint in_stack_00000010;
  cl_sync_point_khr *in_stack_00000018;
  cl_sync_point_khr *in_stack_00000020;
  cl_mutable_command_khr *in_stack_00000028;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  string syncPointWaitList;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  cl_mem in_stack_fffffffffffffd90;
  CLIntercept *in_stack_fffffffffffffd98;
  CLIntercept *in_stack_fffffffffffffda0;
  cl_sync_point_khr *in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  cl_uint cVar8;
  CLIntercept *in_stack_fffffffffffffdb8;
  allocator *paVar9;
  CLIntercept *in_stack_fffffffffffffdd0;
  CLIntercept *this;
  cl_command_buffer_khr in_stack_fffffffffffffdd8;
  CLIntercept *in_stack_fffffffffffffde0;
  SConfig *in_stack_fffffffffffffe00;
  SConfig *in_stack_fffffffffffffe08;
  SConfig *in_stack_fffffffffffffe10;
  CLIntercept *in_stack_fffffffffffffe20;
  allocator *in_stack_fffffffffffffe28;
  undefined1 includeId;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  SConfig *in_stack_fffffffffffffe38;
  CLIntercept *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe50;
  time_point in_stack_fffffffffffffe58;
  int local_164 [6];
  allocator local_149;
  string local_148 [39];
  undefined1 local_121 [56];
  allocator local_e9;
  string local_e8 [44];
  int local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  string local_90 [32];
  uint64_t local_70;
  CLdispatchX *local_68;
  
  cVar8 = (cl_uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  pCVar3 = GetIntercept();
  if ((pCVar3 == (CLIntercept *)0x0) ||
     (local_68 = CLIntercept::dispatchX
                           (in_stack_fffffffffffffda0,
                            (cl_command_buffer_khr)in_stack_fffffffffffffd98),
     local_68->clCommandFillImageKHR ==
     (_func_cl_int_cl_command_buffer_khr_cl_command_queue_cl_command_properties_khr_ptr_cl_mem_void_ptr_size_t_ptr_size_t_ptr_cl_uint_cl_sync_point_khr_ptr_cl_sync_point_khr_ptr_cl_mutable_command_khr_ptr
      *)0x0)) {
    local_164[0] = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_164);
    return -0x472;
  }
  local_70 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffd98);
  getFormattedSyncPointWaitList_abi_cxx11_
            (in_stack_fffffffffffffdb8,cVar8,in_stack_fffffffffffffda8);
  pSVar4 = CLIntercept::config(pCVar3);
  enqueueCounter_00 = local_70;
  this = pCVar3;
  if ((pSVar4->CallLogging & 1U) != 0) {
    uVar5 = std::__cxx11::string::c_str();
    in_stack_fffffffffffffd90 = in_RCX;
    CLIntercept::callLoggingEnter
              (pCVar3,"clCommandFillImageKHR",enqueueCounter_00,(cl_kernel)0x0,
               "command_buffer = %p, command_queue = %p, image = %p%s",in_RDI,in_RSI,in_RCX,uVar5);
  }
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffd90);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffd90);
  tVar6.__d.__r = (duration)CLIntercept::config(this);
  if (((((SConfig *)tVar6.__d.__r)->HostPerformanceTiming & 1U) != 0) ||
     (in_stack_fffffffffffffe58.__d.__r = (duration)CLIntercept::config(this),
     (((SConfig *)in_stack_fffffffffffffe58.__d.__r)->ChromeCallLogging & 1U) != 0)) {
    local_b8 = std::chrono::_V2::steady_clock::now();
    local_a8 = local_b8;
  }
  cVar2 = (*local_68->clCommandFillImageKHR)
                    (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,in_stack_00000010,
                     in_stack_00000018,in_stack_00000020,in_stack_00000028);
  local_bc = cVar2;
  tickEnd.__d.__r = (duration)CLIntercept::config(this);
  if (((((SConfig *)tickEnd.__d.__r)->HostPerformanceTiming & 1U) != 0) ||
     (in_stack_fffffffffffffe40 = (CLIntercept *)CLIntercept::config(this),
     ((in_stack_fffffffffffffe40->m_Mutex).super___mutex_base._M_mutex.__size[0x11] & 1U) != 0)) {
    local_e8._32_8_ = std::chrono::_V2::steady_clock::now();
    local_b0 = local_e8._32_8_;
    in_stack_fffffffffffffe38 = CLIntercept::config(this);
    if (((in_stack_fffffffffffffe38->HostPerformanceTiming & 1U) != 0) &&
       (in_stack_fffffffffffffe37 =
             CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,local_70),
       (bool)in_stack_fffffffffffffe37)) {
      in_stack_fffffffffffffe28 = &local_e9;
      pCVar3 = this;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"",in_stack_fffffffffffffe28);
      local_121._41_8_ = local_a8;
      local_121._33_8_ = local_b0;
      CLIntercept::updateHostTimingStats
                ((CLIntercept *)CONCAT44(cVar2,in_stack_fffffffffffffe50),(char *)tickEnd.__d.__r,
                 (string *)in_stack_fffffffffffffe40,tVar6,in_stack_fffffffffffffe58);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      in_stack_fffffffffffffe20 = this;
      this = pCVar3;
    }
  }
  pSVar4 = CLIntercept::config(this);
  if (((pSVar4->ErrorLogging & 1U) == 0) &&
     (in_stack_fffffffffffffe10 = CLIntercept::config(this),
     (in_stack_fffffffffffffe10->ErrorAssert & 1U) == 0)) {
    in_stack_fffffffffffffe08 = CLIntercept::config(this);
    cVar8 = (cl_uint)((ulong)in_stack_fffffffffffffe10 >> 0x20);
    if ((in_stack_fffffffffffffe08->NoErrors & 1U) == 0) goto LAB_0018b1e8;
  }
  cVar8 = (cl_uint)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  if (local_bc != 0) {
    in_stack_fffffffffffffe00 = CLIntercept::config(this);
    if ((in_stack_fffffffffffffe00->ErrorLogging & 1U) != 0) {
      CLIntercept::logError(in_R8,(char *)in_R9,(cl_int)((ulong)this >> 0x20));
    }
    pSVar7 = CLIntercept::config(this);
    if ((pSVar7->ErrorAssert & 1U) != 0) {
      raise(5);
    }
    pSVar7 = CLIntercept::config(this);
    if ((pSVar7->NoErrors & 1U) != 0) {
      local_bc = 0;
    }
  }
LAB_0018b1e8:
  pCVar3 = this;
  if (((local_bc == 0) && (in_RDI != (cl_command_buffer_khr)0x0)) &&
     (pSVar7 = CLIntercept::config(this), pCVar3 = this, (pSVar7->DumpCommandBuffers & 1U) != 0)) {
    in_stack_fffffffffffffde0 = (CLIntercept *)local_121;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_121 + 1),"",(allocator *)in_stack_fffffffffffffde0);
    CLIntercept::recordCommandBufferCommand
              ((CLIntercept *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (cl_command_buffer_khr)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
               (string *)pSVar4,cVar8,(cl_sync_point_khr *)in_stack_fffffffffffffe08,
               (cl_sync_point_khr *)in_stack_fffffffffffffe40);
    std::__cxx11::string::~string((string *)(local_121 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_121);
    in_stack_fffffffffffffdd0 = this;
    in_stack_fffffffffffffdd8 = in_RDI;
  }
  includeId = (undefined1)((ulong)in_stack_fffffffffffffe28 >> 0x38);
  pSVar7 = CLIntercept::config(pCVar3);
  if ((pSVar7->CallLogging & 1U) != 0) {
    CLIntercept::callLoggingExit
              (in_stack_fffffffffffffe20,&pSVar4->SuppressLogging,cVar8,
               (cl_event *)in_stack_fffffffffffffe08,(cl_sync_point_khr *)in_stack_fffffffffffffe00)
    ;
  }
  cVar8 = (cl_uint)((ulong)pSVar7 >> 0x20);
  pSVar4 = CLIntercept::config(pCVar3);
  if ((pSVar4->ChromeCallLogging & 1U) != 0) {
    paVar9 = &local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"",paVar9);
    local_164._12_8_ = local_a8;
    local_164._4_8_ = local_b0;
    tVar6.__d.__r._4_4_ = cVar2;
    tVar6.__d.__r._0_4_ = in_stack_fffffffffffffe50;
    CLIntercept::chromeCallLoggingExit
              (in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->SuppressLogging,
               (string *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (bool)includeId,(uint64_t)in_stack_fffffffffffffe20,tVar6,tickEnd);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
  }
  if ((in_stack_00000028 != (cl_mutable_command_khr *)0x0) &&
     (*in_stack_00000028 != (cl_mutable_command_khr)0x0)) {
    CLIntercept::addMutableCommandInfo
              (in_stack_fffffffffffffde0,(cl_mutable_command_khr)in_stack_fffffffffffffdd8,
               (cl_command_buffer_khr)in_stack_fffffffffffffdd0,cVar8);
  }
  iVar1 = local_bc;
  std::__cxx11::string::~string(local_90);
  return iVar1;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clCommandFillImageKHR(
    cl_command_buffer_khr command_buffer,
    cl_command_queue command_queue,
    const cl_command_properties_khr* properties,
    cl_mem image,
    const void* fill_color,
    const size_t* origin,
    const size_t* region,
    cl_uint num_sync_points_in_wait_list,
    const cl_sync_point_khr* sync_point_wait_list,
    cl_sync_point_khr* sync_point,
    cl_mutable_command_khr* mutable_handle)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clCommandFillImageKHR )
        {
            GET_ENQUEUE_COUNTER();

            const std::string syncPointWaitList = getFormattedSyncPointWaitList(
                pIntercept,
                num_sync_points_in_wait_list,
                sync_point_wait_list);

            CALL_LOGGING_ENTER(
                "command_buffer = %p, command_queue = %p, image = %p%s",
                command_buffer,
                command_queue,
                image,
                syncPointWaitList.c_str() );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clCommandFillImageKHR(
                command_buffer,
                command_queue,
                properties,
                image,
                fill_color,
                origin,
                region,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point,
                mutable_handle );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            RECORD_COMMAND_BUFFER_COMMAND(
                retVal,
                command_buffer,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point );
            CALL_LOGGING_EXIT_SYNC_POINT( retVal, sync_point );
            ADD_MUTABLE_COMMAND( mutable_handle, command_buffer );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}